

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O0

int __thiscall
CVmObjTemporaryFile::getp_deleteFile
          (CVmObjTemporaryFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_tmpfil_ext *__filename;
  vm_val_t *in_RDX;
  CVmNativeCodeDesc *in_RDI;
  vm_tmpfil_ext *ext;
  uint *in_stack_ffffffffffffffc0;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_deleteFile(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_deleteFile(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_deleteFile::desc,0);
    __cxa_guard_release(&getp_deleteFile(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI)
  ;
  if (iVar1 == 0) {
    __filename = get_ext((CVmObjTemporaryFile *)in_RDI);
    if (__filename->filename[0] != '\0') {
      remove(__filename->filename);
    }
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjTemporaryFile::getp_deleteFile(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* if we have a filename, delete the file */
    vm_tmpfil_ext *ext = get_ext();
    if (ext->filename[0] != '\0')
    {
        /* delete the system file */
        osfdel(ext->filename);
    }

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}